

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

double __thiscall
soplex::SPxSolverBase<double>::coTest(SPxSolverBase<double> *this,int i,Status stat)

{
  double *pdVar1;
  UpdateVector<double> *pUVar2;
  double dVar3;
  
  dVar3 = 0.0;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i] -
            (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    if (dVar3 < 0.0) {
      return dVar3;
    }
  case D_ON_LOWER:
    pdVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + i;
LAB_001f1ca6:
    pUVar2 = this->theCoPvec;
    break;
  case D_ON_UPPER:
    pdVar1 = (this->theCoPvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + i;
    pUVar2 = (UpdateVector<double> *)&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low
    ;
    break;
  case P_ON_LOWER:
    pdVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + i;
    goto LAB_001f1ca6;
  default:
    goto switchD_001f1c38_caseD_fffffffd;
  case P_ON_UPPER:
    pdVar1 = (this->theCoPvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + i;
    pUVar2 = (UpdateVector<double> *)
             &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object;
  }
  dVar3 = *pdVar1 - (pUVar2->super_VectorBase<double>).val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[i];
switchD_001f1c38_caseD_fffffffd:
  return dVar3;
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}